

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize_avx2.c
# Opt level: O3

void av1_quantize_fp_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan_ptr,
               int16_t *iscan_ptr)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  
  auVar6 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])round_ptr),0x54);
  auVar7 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])quant_ptr),0x54);
  auVar8 = vpermq_avx2(ZEXT1632(*(undefined1 (*) [16])dequant_ptr),0x54);
  auVar15 = vpsraw_avx2(auVar8,1);
  auVar12 = vpackssdw_avx2(*(undefined1 (*) [32])coeff_ptr,*(undefined1 (*) [32])(coeff_ptr + 8));
  auVar4 = vpabsw_avx2(auVar12);
  auVar5 = vpcmpgtw_avx2(auVar15,auVar4);
  if (((uint)(SUB321(auVar5 >> 7,0) & 1) | (uint)(SUB321(auVar5 >> 0xf,0) & 1) << 1 |
       (uint)(SUB321(auVar5 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar5 >> 0x1f,0) & 1) << 3 |
       (uint)(SUB321(auVar5 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar5 >> 0x2f,0) & 1) << 5 |
       (uint)(SUB321(auVar5 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar5 >> 0x3f,0) & 1) << 7 |
       (uint)(SUB321(auVar5 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar5 >> 0x4f,0) & 1) << 9 |
       (uint)(SUB321(auVar5 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar5 >> 0x5f,0) & 1) << 0xb |
       (uint)(SUB321(auVar5 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar5 >> 0x6f,0) & 1) << 0xd |
       (uint)(SUB321(auVar5 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar5 >> 0x7f,0) << 0xf |
       (uint)(SUB321(auVar5 >> 0x87,0) & 1) << 0x10 | (uint)(SUB321(auVar5 >> 0x8f,0) & 1) << 0x11 |
       (uint)(SUB321(auVar5 >> 0x97,0) & 1) << 0x12 | (uint)(SUB321(auVar5 >> 0x9f,0) & 1) << 0x13 |
       (uint)(SUB321(auVar5 >> 0xa7,0) & 1) << 0x14 | (uint)(SUB321(auVar5 >> 0xaf,0) & 1) << 0x15 |
       (uint)(SUB321(auVar5 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar5 >> 0xbf,0) << 0x17 |
       (uint)(SUB321(auVar5 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar5 >> 0xcf,0) & 1) << 0x19 |
       (uint)(SUB321(auVar5 >> 0xd7,0) & 1) << 0x1a | (uint)(SUB321(auVar5 >> 0xdf,0) & 1) << 0x1b |
       (uint)(SUB321(auVar5 >> 0xe7,0) & 1) << 0x1c | (uint)(SUB321(auVar5 >> 0xef,0) & 1) << 0x1d |
       (uint)(SUB321(auVar5 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar5[0x1f] >> 7) << 0x1f) ==
      0xffffffff) {
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    auVar12 = auVar13._0_32_;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar12;
    *(undefined1 (*) [32])qcoeff_ptr = auVar12;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar12;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar12;
  }
  else {
    auVar4 = vpaddsw_avx2(auVar4,auVar6);
    auVar4 = vpmulhw_avx2(auVar4,auVar7);
    auVar5 = vpsignw_avx2(auVar4,auVar12);
    auVar12 = vpmullw_avx2(auVar5,auVar8);
    auVar16 = vpsraw_avx2(auVar5,0xf);
    auVar11 = vpunpcklwd_avx2(auVar5,auVar16);
    auVar5 = vpunpckhwd_avx2(auVar5,auVar16);
    *(undefined1 (*) [32])qcoeff_ptr = auVar11;
    *(undefined1 (*) [32])(qcoeff_ptr + 8) = auVar5;
    auVar11 = vpsraw_avx2(auVar12,0xf);
    auVar5 = vpunpcklwd_avx2(auVar12,auVar11);
    auVar12 = vpunpckhwd_avx2(auVar12,auVar11);
    *(undefined1 (*) [32])dqcoeff_ptr = auVar5;
    *(undefined1 (*) [32])(dqcoeff_ptr + 8) = auVar12;
    auVar12 = vpermq_avx2(*(undefined1 (*) [32])iscan_ptr,0xd8);
    auVar4 = vpcmpgtw_avx2(auVar4,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar12 = vpsubw_avx2(auVar12,auVar4);
    auVar12 = vpmaxsw_avx2(auVar12,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar12 = vpand_avx2(auVar4,auVar12);
    auVar13 = ZEXT3264(auVar12);
  }
  auVar12 = auVar13._0_32_;
  if (0x10 < n_coeffs) {
    auVar4 = vpcmpeqd_avx2(auVar4,auVar4);
    auVar4 = vpaddw_avx2(auVar15,auVar4);
    auVar4 = vpermq_avx2(auVar4,0xee);
    auVar5 = vpermq_avx2(auVar8,0xee);
    auVar7 = vpermq_avx2(auVar7,0xee);
    auVar6 = vpermq_avx2(auVar6,0xee);
    uVar9 = n_coeffs + 0x10;
    lVar10 = 0;
    do {
      auVar8 = vpackssdw_avx2(*(undefined1 (*) [32])((long)coeff_ptr + lVar10 * 2 + 0x40),
                              *(undefined1 (*) [32])((long)coeff_ptr + lVar10 * 2 + 0x60));
      auVar12 = vpabsw_avx2(auVar8);
      auVar15 = vpcmpgtw_avx2(auVar12,auVar4);
      auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((((((((((((((((((((((((((auVar15 >> 7 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0 &&
                                       (auVar15 >> 0xf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                      (auVar15 >> 0x17 & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) &&
                                     (auVar15 >> 0x1f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar15 >> 0x27 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar15 >> 0x2f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar15 >> 0x37 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar15 >> 0x3f & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar15 >> 0x47 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && (auVar15 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar15 >> 0x57 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                             (auVar15 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar15 >> 0x67 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar15 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar15 >> 0x77 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar15 >> 0x7f,0) == '\0') &&
                        (auVar15 >> 0x87 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar15 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar15 >> 0x97 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     (auVar15 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar15 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar15 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar15 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar15 >> 0xbf,0) == '\0') &&
                (auVar15 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar15 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar15 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             (auVar15 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar15 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           (auVar15 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar15 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) && -1 < auVar15[0x1f])
      {
        pauVar1 = (undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2 + 0x40);
        pauVar2 = (undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2 + 0x40);
        pauVar2[1] = auVar11;
        *pauVar2 = auVar11;
        pauVar1[1] = auVar11;
        *pauVar1 = auVar11;
      }
      else {
        auVar12 = vpaddsw_avx2(auVar12,auVar6);
        auVar12 = vpmulhw_avx2(auVar12,auVar7);
        auVar15 = vpsignw_avx2(auVar12,auVar8);
        auVar8 = vpmullw_avx2(auVar15,auVar5);
        auVar17 = vpsraw_avx2(auVar15,0xf);
        auVar16 = vpunpcklwd_avx2(auVar15,auVar17);
        auVar15 = vpunpckhwd_avx2(auVar15,auVar17);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2 + 0x40) = auVar16;
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2 + 0x60) = auVar15;
        auVar16 = vpsraw_avx2(auVar8,0xf);
        auVar15 = vpunpcklwd_avx2(auVar8,auVar16);
        auVar8 = vpunpckhwd_avx2(auVar8,auVar16);
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2 + 0x40) = auVar15;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2 + 0x60) = auVar8;
        auVar8 = vpermq_avx2(*(undefined1 (*) [32])((long)iscan_ptr + lVar10 + 0x20),0xd8);
        auVar12 = vpcmpgtw_avx2(auVar12,auVar11);
        auVar8 = vpsubw_avx2(auVar8,auVar12);
        auVar12 = vpand_avx2(auVar12,auVar8);
        auVar12 = vpmaxsw_avx2(auVar13._0_32_,auVar12);
        auVar13 = ZEXT3264(auVar12);
      }
      auVar12 = auVar13._0_32_;
      lVar10 = lVar10 + 0x20;
      uVar9 = uVar9 - 0x10;
    } while (0x20 < uVar9);
  }
  auVar3 = vpmaxsw_avx(auVar12._0_16_,auVar12._16_16_);
  auVar14._8_2_ = 0x7fff;
  auVar14._0_8_ = 0x7fff7fff7fff7fff;
  auVar14._10_2_ = 0x7fff;
  auVar14._12_2_ = 0x7fff;
  auVar14._14_2_ = 0x7fff;
  auVar3 = vpsubusw_avx(auVar14,auVar3);
  auVar3 = vphminposuw_avx(auVar3);
  *eob_ptr = auVar3._0_2_ ^ 0x7fff;
  return;
}

Assistant:

void av1_quantize_fp_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                          const int16_t *zbin_ptr, const int16_t *round_ptr,
                          const int16_t *quant_ptr,
                          const int16_t *quant_shift_ptr,
                          tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                          const int16_t *dequant_ptr, uint16_t *eob_ptr,
                          const int16_t *scan_ptr, const int16_t *iscan_ptr) {
  (void)scan_ptr;
  (void)zbin_ptr;
  (void)quant_shift_ptr;

  const int log_scale = 0;
  const int step = 16;
  __m256i qp[3], thr;
  __m256i eob = _mm256_setzero_si256();

  init_qp(round_ptr, quant_ptr, dequant_ptr, log_scale, &thr, qp);

  quantize_fp_16(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan_ptr += step;
  n_coeffs -= step;

  update_qp(&thr, qp);

  while (n_coeffs > 0) {
    quantize_fp_16(&thr, qp, coeff_ptr, iscan_ptr, qcoeff_ptr, dqcoeff_ptr,
                   &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan_ptr += step;
    n_coeffs -= step;
  }
  *eob_ptr = quant_gather_eob(eob);
}